

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  uint *puVar1;
  float fVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  uchar *puVar7;
  long lVar8;
  ImFont *this;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ImFontAtlasCustomRect *pIVar12;
  uint uVar13;
  int iVar14;
  uint *puVar15;
  uint uVar16;
  int iVar17;
  size_t __n;
  int iVar18;
  long lVar19;
  long lVar20;
  float fVar21;
  size_t local_60;
  ImVec2 uv1;
  ImVec2 uv0;
  
  if ((atlas->TexPixelsAlpha8 == (uchar *)0x0) && (atlas->TexPixelsRGBA32 == (uint *)0x0)) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null || atlas->TexPixelsRGBA32 != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                  ,0xade,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
  }
  pIVar12 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdMouseCursors);
  uVar3 = pIVar12->X;
  if (uVar3 == 0xffff) {
    __assert_fail("r->IsPacked()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                  ,0xa6d,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if ((atlas->Flags & 2) == 0) {
    if ((pIVar12->Width != 0xd9) || (pIVar12->Height != 0x1b)) {
      __assert_fail("r->Width == FONT_ATLAS_DEFAULT_TEX_DATA_W * 2 + 1 && r->Height == FONT_ATLAS_DEFAULT_TEX_DATA_H"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0xa73,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,(uint)uVar3,(uint)pIVar12->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xffffffff);
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,uVar3 + 0x6d,(uint)pIVar12->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xffffffff);
    }
    else {
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,(uint)uVar3,(uint)pIVar12->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xff);
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,uVar3 + 0x6d,(uint)pIVar12->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xff);
    }
  }
  else {
    if ((pIVar12->Width != 2) || (pIVar12->Height != 2)) {
      __assert_fail("r->Width == 2 && r->Height == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0xa84,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar14 = atlas->TexWidth;
    iVar18 = (uint)pIVar12->Y * iVar14 + (uint)uVar3;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar15 = atlas->TexPixelsRGBA32;
      puVar1 = puVar15 + (iVar14 + iVar18);
      puVar1[0] = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar15 = puVar15 + iVar18;
      puVar15[0] = 0xffffffff;
      puVar15[1] = 0xffffffff;
    }
    else {
      atlas->TexPixelsAlpha8[(long)(iVar14 + iVar18) + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar14 + iVar18] = 0xff;
      atlas->TexPixelsAlpha8[(long)iVar18 + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar18] = 0xff;
    }
  }
  uVar3 = pIVar12->Y;
  fVar2 = (atlas->TexUvScale).y;
  (atlas->TexUvWhitePixel).x = ((float)pIVar12->X + 0.5) * (atlas->TexUvScale).x;
  (atlas->TexUvWhitePixel).y = ((float)uVar3 + 0.5) * fVar2;
  if ((atlas->Flags & 4) == 0) {
    pIVar12 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdLines);
    if (pIVar12->X == 0xffff) {
      __assert_fail("r->IsPacked()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0xa99,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
    }
    local_60 = 0;
    lVar20 = -0x40;
    iVar18 = 0;
    iVar14 = 0;
    do {
      if ((ulong)pIVar12->Height <= lVar20 + 0x40U) {
        __assert_fail("pad_left + line_width + pad_right == r->Width && y < r->Height",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                      ,0xaa3,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
      }
      uVar3 = pIVar12->Width;
      uVar13 = iVar14 + (uint)uVar3;
      uVar10 = uVar13 >> 1;
      uVar9 = (ulong)uVar10;
      iVar11 = (int)lVar20;
      uVar16 = iVar11 + uVar10 + 0x40;
      iVar17 = (uVar3 - uVar10) + iVar14;
      puVar7 = atlas->TexPixelsAlpha8;
      if (puVar7 == (uchar *)0x0) {
        puVar15 = atlas->TexPixelsRGBA32;
        uVar4 = pIVar12->X;
        uVar5 = pIVar12->Y;
        iVar6 = atlas->TexWidth;
        puVar1 = puVar15 + ((iVar11 + (uint)uVar5 + 0x40) * iVar6 + (uint)uVar4);
        if (1 < uVar13) {
          memset(puVar1,0,(ulong)(uVar10 + (uVar10 == 0)) << 2);
        }
        if (lVar20 != -0x40) {
          memset(puVar1 + uVar9,0xff,local_60);
        }
        if (uVar16 != uVar3) {
          puVar15 = puVar15 + (ulong)(iVar6 * ((uint)uVar5 + iVar18) + (uint)uVar4) +
                              uVar9 + lVar20 + 0x40;
          __n = (ulong)(iVar17 + (uint)(iVar17 == 0)) << 2;
          goto LAB_001d1c6b;
        }
      }
      else {
        uVar4 = pIVar12->X;
        uVar5 = pIVar12->Y;
        iVar6 = atlas->TexWidth;
        if (1 < uVar13) {
          memset(puVar7 + ((iVar11 + (uint)uVar5 + 0x40) * iVar6 + (uint)uVar4),0,
                 (ulong)(uVar10 + (uVar10 == 0)));
        }
        if (lVar20 != -0x40) {
          memset(puVar7 + ((iVar11 + (uint)uVar5 + 0x40) * iVar6 + (uint)uVar4) + uVar9,0xff,
                 lVar20 + 0x40U);
        }
        if (uVar16 != uVar3) {
          puVar15 = (uint *)(puVar7 + lVar20 + (iVar6 * ((uint)uVar5 + iVar18) + (uint)uVar4) +
                                               uVar9 + 0x40);
          __n = (size_t)(iVar17 + (uint)(iVar17 == 0));
LAB_001d1c6b:
          memset(puVar15,0,__n);
        }
      }
      uVar3 = pIVar12->X;
      fVar2 = (atlas->TexUvScale).x;
      fVar21 = (atlas->TexUvScale).y;
      fVar21 = ((float)(int)(iVar11 + 0x41 + (uint)pIVar12->Y) * fVar21 +
               (float)(int)(iVar11 + 0x40 + (uint)pIVar12->Y) * fVar21) * 0.5;
      (&atlas->TexUvLines[0].x)[local_60] = (float)((uVar10 + uVar3) - 1) * fVar2;
      (&atlas->TexUvLines[0].y)[local_60] = fVar21;
      (&atlas->TexUvLines[0].z)[local_60] = (float)(iVar11 + uVar10 + uVar3 + 0x41) * fVar2;
      (&atlas->TexUvLines[0].w)[local_60] = fVar21;
      iVar14 = iVar14 + -1;
      iVar18 = iVar18 + 1;
      local_60 = local_60 + 4;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0);
  }
  if (0 < (atlas->CustomRects).Size) {
    lVar20 = 0;
    lVar19 = 0;
    do {
      pIVar12 = (atlas->CustomRects).Data;
      lVar8 = *(long *)((long)&pIVar12->Font + lVar20);
      if ((lVar8 != 0) && (*(int *)((long)&pIVar12->GlyphID + lVar20) != 0)) {
        if (*(ImFontAtlas **)(lVar8 + 0x40) != atlas) {
          __assert_fail("r->Font->ContainerAtlas == atlas",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                        ,0xaea,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
        }
        uv0.x = 0.0;
        uv0.y = 0.0;
        uv1.x = 0.0;
        uv1.y = 0.0;
        ImFontAtlas::CalcCustomRectUV
                  (atlas,(ImFontAtlasCustomRect *)((long)&pIVar12->Width + lVar20),&uv0,&uv1);
        fVar2 = *(float *)((long)&(pIVar12->GlyphOffset).x + lVar20);
        fVar21 = *(float *)((long)&(pIVar12->GlyphOffset).y + lVar20);
        ImFont::AddGlyph(*(ImFont **)((long)&pIVar12->Font + lVar20),(ImFontConfig_conflict *)0x0,
                         *(ImWchar *)((long)&pIVar12->GlyphID + lVar20),fVar2,fVar21,
                         (float)*(ushort *)((long)&pIVar12->Width + lVar20) + fVar2,
                         (float)*(ushort *)((long)&pIVar12->Height + lVar20) + fVar21,uv0.x,uv0.y,
                         uv1.x,uv1.y,*(float *)((long)&pIVar12->GlyphAdvanceX + lVar20));
      }
      lVar19 = lVar19 + 1;
      lVar20 = lVar20 + 0x20;
    } while (lVar19 < (atlas->CustomRects).Size);
  }
  if (0 < (atlas->Fonts).Size) {
    lVar20 = 0;
    do {
      this = (atlas->Fonts).Data[lVar20];
      if (this->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(this);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < (atlas->Fonts).Size);
  }
  atlas->TexReady = true;
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    atlas->TexReady = true;
}